

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O3

void Js::PropertyValueInfo::SetCacheInfo(PropertyValueInfo *info,InlineCache *inlineCache)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (info == (PropertyValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                ,0xe,"(info)","info");
    if (!bVar2) goto LAB_00dcd6e5;
    *puVar3 = 0;
  }
  if (inlineCache == (InlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                ,0xf,"(inlineCache)","inlineCache");
    if (!bVar2) {
LAB_00dcd6e5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  info->inlineCache = inlineCache;
  info->polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info->functionBody = (FunctionBody *)0x0;
  info->inlineCacheIndex = 0xffffffff;
  info->allowResizingPolymorphicInlineCache = false;
  return;
}

Assistant:

void PropertyValueInfo::SetCacheInfo(PropertyValueInfo* info, InlineCache *const inlineCache)
    {
        Assert(info);
        Assert(inlineCache);

        info->functionBody = nullptr;
        info->inlineCache = inlineCache;
        info->polymorphicInlineCache = nullptr;
        info->inlineCacheIndex = Js::Constants::NoInlineCacheIndex;
        info->allowResizingPolymorphicInlineCache = false;
    }